

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

void __thiscall libtorrent::settings_pack::clear(settings_pack *this)

{
  pointer ppVar1;
  pointer ppVar2;
  
  ::std::
  vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->m_strings);
  ppVar1 = (this->m_ints).
           super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_ints).
      super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->m_ints).
    super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  ppVar2 = (this->m_bools).
           super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_bools).
      super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->m_bools).
    super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  return;
}

Assistant:

void settings_pack::clear()
	{
		m_strings.clear();
		m_ints.clear();
		m_bools.clear();
	}